

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O1

void __thiscall YAML::Scanner::ScanTag(Scanner *this)

{
  bool bVar1;
  char cVar2;
  bool *canBeHandle_00;
  Stream *INPUT;
  Stream *INPUT_00;
  bool canBeHandle;
  string tag;
  char local_99;
  string local_98;
  undefined1 local_78 [24];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [20];
  undefined8 uStack_2c;
  
  InsertPotentialSimpleKey(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  local_78._8_4_ = (this->INPUT).m_mark.pos;
  local_78._12_4_ = (this->INPUT).m_mark.line;
  local_78._16_4_ = (this->INPUT).m_mark.column;
  canBeHandle_00 = (bool *)(ulong)(uint)local_78._16_4_;
  local_78._0_4_ = VALID;
  local_78._4_4_ = TAG;
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40._0_8_ = (pointer)0x0;
  local_40._8_4_ = 0;
  local_40._12_4_ = 0;
  local_40._16_4_ = 0;
  uStack_2c = 0;
  local_60._M_p = (pointer)&local_50;
  YAML::Stream::get(&this->INPUT);
  bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
  if (bVar1) {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '<') {
      ScanVerbatimTag_abi_cxx11_(&local_98,(YAML *)this,INPUT);
      std::__cxx11::string::_M_assign((string *)&local_60);
      uStack_2c = uStack_2c & 0xffffffff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      goto LAB_007254be;
    }
  }
  ScanTagHandle_abi_cxx11_(&local_98,(YAML *)this,(Stream *)&local_99,canBeHandle_00);
  std::__cxx11::string::_M_assign((string *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((local_99 == '\0') && (local_58 == 0)) {
    uStack_2c = CONCAT44(4,(undefined4)uStack_2c);
  }
  else if (local_58 == 0) {
    uStack_2c = CONCAT44(2,(undefined4)uStack_2c);
  }
  else {
    uStack_2c = CONCAT44(1,(undefined4)uStack_2c);
  }
  if (local_99 != '\0') {
    cVar2 = YAML::Stream::peek(&this->INPUT);
    if (cVar2 == '!') {
      YAML::Stream::get(&this->INPUT);
      ScanTagSuffix_abi_cxx11_(&local_98,(YAML *)this,INPUT_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      uStack_2c = CONCAT44(3,(undefined4)uStack_2c);
    }
  }
LAB_007254be:
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::push_back
            (&(this->m_tokens).c,(value_type *)local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  return;
}

Assistant:

void Scanner::ScanTag() {
  // insert a potential simple key
  InsertPotentialSimpleKey();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  Token token(Token::TAG, INPUT.mark());

  // eat the indicator
  INPUT.get();

  if (INPUT && INPUT.peek() == Keys::VerbatimTagStart) {
    std::string tag = ScanVerbatimTag(INPUT);

    token.value = tag;
    token.data = Tag::VERBATIM;
  } else {
    bool canBeHandle;
    token.value = ScanTagHandle(INPUT, canBeHandle);
    if (!canBeHandle && token.value.empty())
      token.data = Tag::NON_SPECIFIC;
    else if (token.value.empty())
      token.data = Tag::SECONDARY_HANDLE;
    else
      token.data = Tag::PRIMARY_HANDLE;

    // is there a suffix?
    if (canBeHandle && INPUT.peek() == Keys::Tag) {
      // eat the indicator
      INPUT.get();
      token.params.push_back(ScanTagSuffix(INPUT));
      token.data = Tag::NAMED_HANDLE;
    }
  }

  m_tokens.push(token);
}